

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseArray.h
# Opt level: O0

Value * __thiscall SparseArray<Value>::Get(SparseArray<Value> *this,uint32 index)

{
  SAChunk<Value> *pSStack_28;
  uint32 indexInChunk;
  SAChunk<Value> *chunk;
  uint32 index_local;
  SparseArray<Value> *this_local;
  
  pSStack_28 = this->firstChunk;
  while( true ) {
    if (pSStack_28 == (SAChunk<Value> *)0x0) {
      return (Value *)0x0;
    }
    if (index < pSStack_28->startIndex) break;
    if (index < pSStack_28->startIndex + this->chunkSize) {
      return (Value *)(&pSStack_28[1].next)[index % this->chunkSize];
    }
    pSStack_28 = pSStack_28->next;
  }
  return (Value *)0x0;
}

Assistant:

T * Get(uint32 index)
    {
        SAChunk<T> * chunk;
        uint32 indexInChunk = (index % this->chunkSize);

        for (chunk = this->firstChunk; chunk; chunk = chunk->next)
        {
            if (index < chunk->startIndex)
            {
                return NULL;
            }
            if (index < chunk->startIndex + this->chunkSize)
            {
                return chunk->data[indexInChunk];
            }
        }

        return NULL;
    }